

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

WeightParams * __thiscall
CoreML::Specification::SimpleRecurrentLayerParams::_internal_mutable_recursionmatrix
          (SimpleRecurrentLayerParams *this)

{
  Arena *arena;
  WeightParams *pWVar1;
  WeightParams *p;
  SimpleRecurrentLayerParams *this_local;
  
  if (this->recursionmatrix_ == (WeightParams *)0x0) {
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pWVar1 = google::protobuf::MessageLite::CreateMaybeMessage<CoreML::Specification::WeightParams>
                       (arena);
    this->recursionmatrix_ = pWVar1;
  }
  return this->recursionmatrix_;
}

Assistant:

inline ::CoreML::Specification::WeightParams* SimpleRecurrentLayerParams::_internal_mutable_recursionmatrix() {
  
  if (recursionmatrix_ == nullptr) {
    auto* p = CreateMaybeMessage<::CoreML::Specification::WeightParams>(GetArenaForAllocation());
    recursionmatrix_ = p;
  }
  return recursionmatrix_;
}